

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

char * deqp::egl::Image::CreateImageGLES2::getTargetName(EGLint target)

{
  char *pcStack_10;
  EGLint target_local;
  
  if (target == 0x30b1) {
    pcStack_10 = "tex2d";
  }
  else if (target == 0x30b3) {
    pcStack_10 = "cubemap_pos_x";
  }
  else if (target == 0x30b4) {
    pcStack_10 = "cubemap_neg_x";
  }
  else if (target == 0x30b5) {
    pcStack_10 = "cubemap_pos_y";
  }
  else if (target == 0x30b6) {
    pcStack_10 = "cubemap_neg_y";
  }
  else if (target == 0x30b7) {
    pcStack_10 = "cubemap_pos_z";
  }
  else if (target == 0x30b8) {
    pcStack_10 = "cubemap_neg_z";
  }
  else if (target == 0x30b9) {
    pcStack_10 = "renderbuffer";
  }
  else if (target == 0x3140) {
    pcStack_10 = "android_native";
  }
  else {
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

static const char* getTargetName (EGLint target)
	{
		switch (target)
		{
			case EGL_GL_TEXTURE_2D_KHR:						return "tex2d";
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_X_KHR:	return "cubemap_pos_x";
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_X_KHR:	return "cubemap_neg_x";
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Y_KHR:	return "cubemap_pos_y";
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Y_KHR:	return "cubemap_neg_y";
			case EGL_GL_TEXTURE_CUBE_MAP_POSITIVE_Z_KHR:	return "cubemap_pos_z";
			case EGL_GL_TEXTURE_CUBE_MAP_NEGATIVE_Z_KHR:	return "cubemap_neg_z";
			case EGL_GL_RENDERBUFFER_KHR:					return "renderbuffer";
			case EGL_NATIVE_BUFFER_ANDROID:					return "android_native";
			default:		DE_ASSERT(DE_FALSE);			return "";
		}
	}